

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int libssh2_session_last_error(LIBSSH2_SESSION *session,char **errmsg,int *errmsg_len,int want_buf)

{
  int iVar1;
  size_t __n;
  char *__dest;
  char *pcVar2;
  
  if (session->err_code == 0) {
    if (errmsg != (char **)0x0) {
      if (want_buf == 0) {
        *errmsg = "";
      }
      else {
        pcVar2 = (char *)(*session->alloc)(1,&session->abstract);
        *errmsg = pcVar2;
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
      }
    }
    iVar1 = 0;
    if (errmsg_len != (int *)0x0) {
      *errmsg_len = 0;
    }
  }
  else {
    if (errmsg == (char **)0x0) {
      __n = 0;
    }
    else {
      pcVar2 = "";
      if (session->err_msg != (char *)0x0) {
        pcVar2 = session->err_msg;
      }
      __n = strlen(pcVar2);
      if (want_buf == 0) {
        *errmsg = pcVar2;
      }
      else {
        __dest = (char *)(*session->alloc)(__n + 1,&session->abstract);
        *errmsg = __dest;
        if (__dest != (char *)0x0) {
          memcpy(__dest,pcVar2,__n);
          (*errmsg)[__n] = '\0';
        }
      }
    }
    if (errmsg_len != (int *)0x0) {
      *errmsg_len = (int)__n;
    }
    iVar1 = session->err_code;
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_session_last_error(LIBSSH2_SESSION * session, char **errmsg,
                           int *errmsg_len, int want_buf)
{
    size_t msglen = 0;

    /* No error to report */
    if (!session->err_code) {
        if (errmsg) {
            if (want_buf) {
                *errmsg = LIBSSH2_ALLOC(session, 1);
                if (*errmsg) {
                    **errmsg = 0;
                }
            } else {
                *errmsg = (char *) "";
            }
        }
        if (errmsg_len) {
            *errmsg_len = 0;
        }
        return 0;
    }

    if (errmsg) {
        const char *error = session->err_msg ? session->err_msg : "";

        msglen = strlen(error);

        if (want_buf) {
            /* Make a copy so the calling program can own it */
            *errmsg = LIBSSH2_ALLOC(session, msglen + 1);
            if (*errmsg) {
                memcpy(*errmsg, error, msglen);
                (*errmsg)[msglen] = 0;
            }
        }
        else
            *errmsg = (char *)error;
    }

    if (errmsg_len) {
        *errmsg_len = msglen;
    }

    return session->err_code;
}